

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator.h
# Opt level: O1

void __thiscall Nova::Grid_Iterator<float,_2>::Next_Helper(Grid_Iterator<float,_2> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar2 = (this->index)._data._M_elems[0];
  (this->index)._data._M_elems[1] = (this->region).min_corner._data._M_elems[1];
  iVar3 = iVar2 + 1;
  iVar1 = (this->region).max_corner._data._M_elems[0];
  if (iVar1 <= iVar2) {
    iVar3 = (this->region).min_corner._data._M_elems[0];
  }
  (this->index)._data._M_elems[0] = iVar3;
  if (iVar1 <= iVar2) {
    uVar4 = (ulong)this->current_region;
    iVar3 = this->current_region + 1;
    this->valid = iVar3 < this->number_of_regions;
    if (iVar3 < this->number_of_regions) {
      this->current_region = iVar3;
      if ((uVar4 & 0xfffffffffffffff) != 0xffffffffffffffe) {
        *(undefined8 *)(this->region).min_corner._data._M_elems =
             *(undefined8 *)this->regions[uVar4 + 1].min_corner._data._M_elems;
        *(undefined8 *)(this->region).max_corner._data._M_elems =
             *(undefined8 *)this->regions[uVar4 + 1].max_corner._data._M_elems;
      }
      *(undefined8 *)(this->index)._data._M_elems =
           *(undefined8 *)(this->region).min_corner._data._M_elems;
    }
  }
  return;
}

Assistant:

void Next_Helper()
    {
        index(d-1)=region.min_corner(d-1);
        for(int i=d-2;i>=0;--i)
        {
            if(index(i)<region.max_corner(i)){++index(i);return;}
            index(i)=region.min_corner(i);
        }
        Reset(current_region+1);
    }